

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O0

void duckdb::RegularLikeFunction<duckdb::NotLikeOperator,true>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  bool bVar1;
  anon_class_8_1_b578bc12 fun;
  reference __n;
  reference result_00;
  Vector *in_RDX;
  BaseExpression *in_RSI;
  DataChunk *in_RDI;
  LikeMatcher *matcher;
  BoundFunctionExpression *func_expr;
  idx_t in_stack_ffffffffffffffa8;
  Vector *in_stack_ffffffffffffffb0;
  Vector *in_stack_ffffffffffffffb8;
  Vector *in_stack_ffffffffffffffc0;
  
  BaseExpression::Cast<duckdb::BoundFunctionExpression>(in_RSI);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> *
                     )0x1373b57);
  if (bVar1) {
    unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::operator->
              ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
               in_stack_ffffffffffffffb0);
    FunctionData::Cast<duckdb::LikeMatcher>((FunctionData *)in_stack_ffffffffffffffb0);
    fun.matcher = (LikeMatcher *)
                  vector<duckdb::Vector,_true>::operator[]
                            ((vector<duckdb::Vector,_true> *)in_stack_ffffffffffffffb0,
                             in_stack_ffffffffffffffa8);
    DataChunk::size(in_RDI);
    UnaryExecutor::
    Execute<duckdb::string_t,bool,duckdb::RegularLikeFunction<duckdb::NotLikeOperator,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t)_1_>
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,fun,
               CANNOT_ERROR);
  }
  else {
    __n = vector<duckdb::Vector,_true>::operator[]
                    ((vector<duckdb::Vector,_true> *)in_stack_ffffffffffffffb0,
                     in_stack_ffffffffffffffa8);
    result_00 = vector<duckdb::Vector,_true>::operator[]
                          ((vector<duckdb::Vector,_true> *)in_stack_ffffffffffffffb0,(size_type)__n)
    ;
    DataChunk::size(in_RDI);
    BinaryExecutor::ExecuteStandard<duckdb::string_t,duckdb::string_t,bool,duckdb::NotLikeOperator>
              (in_stack_ffffffffffffffc0,in_RDX,result_00,(idx_t)__n);
  }
  return;
}

Assistant:

static void RegularLikeFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	if (func_expr.bind_info) {
		auto &matcher = func_expr.bind_info->Cast<LikeMatcher>();
		// use fast like matcher
		UnaryExecutor::Execute<string_t, bool>(input.data[0], result, input.size(), [&](string_t input) {
			return INVERT ? !matcher.Match(input) : matcher.Match(input);
		});
	} else {
		// use generic like matcher
		BinaryExecutor::ExecuteStandard<string_t, string_t, bool, OP>(input.data[0], input.data[1], result,
		                                                              input.size());
	}
}